

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntaxAnalysis.cpp
# Opt level: O2

int constDefineInt(function *fn)

{
  int l;
  reference pvVar1;
  string sStack_f8;
  string id;
  Identifier con;
  string local_48;
  
  getToken();
  pvVar1 = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::at(&formerAns_abi_cxx11_,
                ~(long)tokenPointer +
                ((long)formerAns_abi_cxx11_.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)formerAns_abi_cxx11_.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x28);
  l = pvVar1->second;
  pvVar1 = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::at(&formerAns_abi_cxx11_,
                ~(long)tokenPointer +
                ((long)formerAns_abi_cxx11_.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)formerAns_abi_cxx11_.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x28);
  std::__cxx11::string::string((string *)&id,(string *)pvVar1);
  getToken();
  getToken();
  integer(0,1);
  std::__cxx11::string::string((string *)&sStack_f8,(string *)&id);
  Identifier::Identifier(&con,&sStack_f8,INTTK);
  std::__cxx11::string::~string((string *)&sStack_f8);
  Identifier::setValue(&con,num);
  Identifier::setDimension(&con,1,1);
  Identifier::setDimension(&con,2,1);
  Identifier::setIdentifierCategory(&con,CONST);
  tokenType::getName_abi_cxx11_(&local_48,&fn->super_tokenType);
  std::__cxx11::string::~string((string *)&local_48);
  if (local_48._M_string_length == 0) {
    identityTable::addToken(&globalTable,&con,l);
  }
  else {
    function::addToken(fn,&con,l);
  }
  getToken();
  Identifier::~Identifier(&con);
  std::__cxx11::string::~string((string *)&id);
  return 1;
}

Assistant:

int constDefineInt(function &fn) {
    getToken();//IDENFR
    int l = formerAns.at(formerAns.size() - 1 - tokenPointer).second;
    string id = formerAns.at(formerAns.size() - 1 - tokenPointer).first;
    getToken();//ASSIGN
    getToken();
    integer(0, 1);
    Identifier con(id, INTTK);
    con.setValue(num);
    con.setDimension(1, 1);
    con.setDimension(2, 1);
    con.setIdentifierCategory(CONST);
    if (fn.getName().empty())
        globalTable.addToken(con, l);
    else
        fn.addToken(con, l);
    getToken();
    return 1;
}